

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

Var Js::JavascriptPromise::EntryThen(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptPromise *sourcePromise;
  JavascriptFunction *fulfillmentHandler;
  JavascriptFunction *rejectionHandler;
  int in_stack_00000010;
  undefined1 local_68 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x360,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b9cdc1;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,(CallInfo *)&__tag.entry.next,(Var *)&stack0x00000018
            );
  if (((uint)__tag.entry.next >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x361,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00b9cdc1:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_68,function,(CallInfo)__tag.entry.next,
             L"Promise.prototype.then",&stack0x00000000);
  if ((callInfo_local._0_4_ & 0xffffff) == 0) {
LAB_00b9cdad:
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ea11,L"Promise.prototype.then");
  }
  pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  bVar4 = VarIs<Js::JavascriptPromise>(pvVar6);
  if (!bVar4) goto LAB_00b9cdad;
  pJVar2 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  sourcePromise = VarTo<Js::JavascriptPromise>(pvVar6);
  if ((callInfo_local._0_4_ & 0xfffffe) == 0) {
LAB_00b9cd35:
    fulfillmentHandler = (pJVar2->identityFunction).ptr;
  }
  else {
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    bVar4 = JavascriptConversion::IsCallable(pvVar6);
    if (!bVar4) goto LAB_00b9cd35;
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    fulfillmentHandler = (JavascriptFunction *)VarTo<Js::RecyclableObject>(pvVar6);
  }
  if (2 < (callInfo_local._0_4_ & 0xffffff)) {
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,2);
    bVar4 = JavascriptConversion::IsCallable(pvVar6);
    if (bVar4) {
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,2);
      rejectionHandler = (JavascriptFunction *)VarTo<Js::RecyclableObject>(pvVar6);
      goto LAB_00b9cd83;
    }
  }
  rejectionHandler = (pJVar2->throwerFunction).ptr;
LAB_00b9cd83:
  pvVar6 = CreateThenPromise(sourcePromise,(RecyclableObject *)fulfillmentHandler,
                             (RecyclableObject *)rejectionHandler,pSVar1);
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_68);
  return pvVar6;
}

Assistant:

Var JavascriptPromise::EntryThen(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise.prototype.then"));

        if (args.Info.Count < 1 || !VarIs<JavascriptPromise>(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedPromise, _u("Promise.prototype.then"));
        }

        JavascriptLibrary* library = scriptContext->GetLibrary();
        JavascriptPromise* promise = VarTo<JavascriptPromise>(args[0]);
        RecyclableObject* rejectionHandler;
        RecyclableObject* fulfillmentHandler;

        if (args.Info.Count > 1 && JavascriptConversion::IsCallable(args[1]))
        {
            fulfillmentHandler = VarTo<RecyclableObject>(args[1]);
        }
        else
        {
            fulfillmentHandler = library->GetIdentityFunction();
        }

        if (args.Info.Count > 2 && JavascriptConversion::IsCallable(args[2]))
        {
            rejectionHandler = VarTo<RecyclableObject>(args[2]);
        }
        else
        {
            rejectionHandler = library->GetThrowerFunction();
        }

        return CreateThenPromise(promise, fulfillmentHandler, rejectionHandler, scriptContext);
    }